

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::root_name(path *this)

{
  path *in_RSI;
  path *in_RDI;
  path *ppVar1;
  string_type *source;
  path *in_stack_ffffffffffffffc0;
  string_type local_30;
  format fmt;
  
  ppVar1 = in_RDI;
  root_name_length(in_RSI);
  fmt = (format)((ulong)ppVar1 >> 0x20);
  source = &local_30;
  std::__cxx11::string::substr((ulong)source,(ulong)in_RSI);
  path(in_stack_ffffffffffffffc0,source,fmt);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

GHC_INLINE path path::root_name() const
{
    return path(_path.substr(_prefixLength, root_name_length()), native_format);
}